

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O1

void __thiscall Hpipe::CharItem::CharItem(CharItem *this,int type)

{
  this->type = type;
  (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
  super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
  super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
  super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->prev).super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
  super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prev).super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
  super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prev).super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
  super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Cond::Cond(&this->cond);
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  this->op_id = 0;
  CharItem::sid = CharItem::sid + 1;
  this->display_id = CharItem::sid;
  return;
}

Assistant:

CharItem::CharItem( int type ) : type( type ), op_id( 0 ) {
    static unsigned sid = 0;
    display_id = ++sid;
}